

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

callback_t *
initial_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  char t;
  QDebug *this;
  code *pcVar1;
  QDebug local_40 [8];
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  undefined8 local_20;
  
  clear_empty(f);
  t = std::istream::peek();
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_38 = 2;
    local_34 = 0;
    uStack_2c = 0;
    local_24 = 0;
    local_20 = parser()::category._8_8_;
    QMessageLogger::debug();
    this = QDebug::operator<<(local_40,"Peeking");
    QDebug::operator<<(this,t);
    QDebug::~QDebug(local_40);
  }
  if (t == -1) {
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  }
  else {
    if (t == '#') {
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      pcVar1 = state_include;
    }
    else if (t == '/') {
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      pcVar1 = guess_documentation_state;
    }
    else if (t == '{') {
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      pcVar1 = begin_class_state;
    }
    else {
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      pcVar1 = multi_purpose_string_state;
    }
    *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar1;
    __return_storage_ptr__->_M_invoker =
         std::
         _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
         ::_M_invoke;
    (__return_storage_ptr__->super__Function_base)._M_manager =
         std::
         _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
         ::_M_manager;
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t initial_state(MetaConfiguration &conf, std::ifstream &f,
                         int &error) {
  clear_empty(f);

  char c = f.peek();
  qCDebug(parser) << "Peeking" << c;
  switch (c) {
  case '#':
    return state_include;
  case '{':
    return begin_class_state;
  // case '[' : return begin_array_state;
  case '/':
    return guess_documentation_state;
  case EOF:
    return nullptr;
  default:
    return multi_purpose_string_state;
  }
  return nullptr;
}